

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_converters.c
# Opt level: O2

void Float32_To_Int24_Clip
               (void *destinationBuffer,int destinationStride,void *sourceBuffer,int sourceStride,
               uint count,PaUtilTriangularDitherGenerator *ditherGenerator)

{
  float fVar1;
  int iVar2;
  undefined1 *puVar3;
  bool bVar4;
  float fVar5;
  
  puVar3 = (undefined1 *)((long)destinationBuffer + 2);
  while (bVar4 = count != 0, count = count - 1, bVar4) {
    fVar5 = *sourceBuffer * 2.1474836e+09;
    iVar2 = -0x80000000;
    if (-2.1474836e+09 <= fVar5) {
      fVar1 = 2.1474836e+09;
      if (fVar5 <= 2.1474836e+09) {
        fVar1 = fVar5;
      }
      iVar2 = (int)fVar1;
    }
    puVar3[-2] = (char)((uint)iVar2 >> 8);
    puVar3[-1] = (char)((uint)iVar2 >> 0x10);
    *puVar3 = (char)((uint)iVar2 >> 0x18);
    sourceBuffer = (void *)((long)sourceBuffer + (long)sourceStride * 4);
    puVar3 = puVar3 + destinationStride * 3;
  }
  return;
}

Assistant:

static void Float32_To_Int24_Clip(
    void *destinationBuffer, signed int destinationStride,
    void *sourceBuffer, signed int sourceStride,
    unsigned int count, struct PaUtilTriangularDitherGenerator *ditherGenerator )
{
    float *src = (float*)sourceBuffer;
    unsigned char *dest = (unsigned char*)destinationBuffer;
    PaInt32 temp;

    (void) ditherGenerator; /* unused parameter */

    while( count-- )
    {
        /* convert to 32 bit and drop the low 8 bits */
        double scaled = *src * 0x7FFFFFFF;
        PA_CLIP_( scaled, -2147483648., 2147483647.  );
        temp = (PaInt32) scaled;

#if defined(PA_LITTLE_ENDIAN)
        dest[0] = (unsigned char)(temp >> 8);
        dest[1] = (unsigned char)(temp >> 16);
        dest[2] = (unsigned char)(temp >> 24);
#elif defined(PA_BIG_ENDIAN)
        dest[0] = (unsigned char)(temp >> 24);
        dest[1] = (unsigned char)(temp >> 16);
        dest[2] = (unsigned char)(temp >> 8);
#endif

        src += sourceStride;
        dest += destinationStride * 3;
    }
}